

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bandpre.c
# Opt level: O3

int CVBandPrecSetup(sunrealtype t,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
                   void *bp_data)

{
  CVodeMem cv_mem;
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  sunrealtype *psVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *msgfmt;
  long j;
  long lVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double local_c8;
  long local_b8;
  double local_b0;
  long local_a0;
  
  cv_mem = *(CVodeMem *)((long)bp_data + 0x48);
  if (jok == 0) {
    *jcurPtr = 1;
    iVar6 = SUNMatZero(*(undefined8 *)((long)bp_data + 0x18));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x181;
      goto LAB_00110404;
    }
    if (iVar6 != 0) {
      return 1;
    }
    uVar1 = *(undefined8 *)((long)bp_data + 0x30);
    uVar2 = *(undefined8 *)((long)bp_data + 0x38);
    lVar3 = *(long *)((long)bp_data + 0x48);
    lVar7 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 200));
    lVar8 = N_VGetArrayPointer(fy);
    lVar9 = N_VGetArrayPointer(uVar1);
    lVar10 = N_VGetArrayPointer(y);
    lVar11 = N_VGetArrayPointer(uVar2);
    if (*(int *)(lVar3 + 0x58) == 0) {
      local_b8 = 0;
    }
    else {
      local_b8 = N_VGetArrayPointer(*(undefined8 *)(lVar3 + 0x108));
    }
    local_b0 = 1.0;
    N_VScale(y,uVar2);
    dVar22 = *(double *)(lVar3 + 8);
    local_c8 = 0.0;
    if (0.0 < dVar22) {
      if (dVar22 < 0.0) {
        local_c8 = sqrt(dVar22);
      }
      else {
        local_c8 = SQRT(dVar22);
      }
    }
    dVar22 = (double)N_VWrmsNorm(fy,*(undefined8 *)(lVar3 + 200));
    lVar14 = *bp_data;
    if ((dVar22 != 0.0) || (NAN(dVar22))) {
      local_b0 = dVar22 * (double)lVar14 *
                          ABS(*(double *)(lVar3 + 0x140)) * 1000.0 * *(double *)(lVar3 + 8);
    }
    lVar4 = *(long *)((long)bp_data + 8);
    lVar5 = *(long *)((long)bp_data + 0x10);
    lVar20 = lVar4 + lVar5 + 1;
    lVar17 = lVar14;
    if (lVar20 < lVar14) {
      lVar17 = lVar20;
    }
    if (0 < lVar17) {
      local_a0 = 0;
      lVar12 = 1;
      do {
        j = lVar12 + -1;
        if (lVar12 <= lVar14) {
          iVar6 = *(int *)(lVar3 + 0x58);
          lVar15 = j;
          do {
            dVar22 = *(double *)(lVar10 + lVar15 * 8);
            dVar24 = local_b0 / *(double *)(lVar7 + lVar15 * 8);
            dVar23 = ABS(dVar22) * local_c8;
            if (ABS(dVar22) * local_c8 <= dVar24) {
              dVar23 = dVar24;
            }
            if (iVar6 != 0) {
              dVar24 = *(double *)(local_b8 + lVar15 * 8);
              dVar25 = ABS(dVar24);
              if ((dVar25 != 1.0) || (NAN(dVar25))) {
                if ((dVar25 == 2.0) && ((!NAN(dVar25) && ((dVar22 + dVar23) * dVar24 <= 0.0))))
                goto LAB_001105d4;
              }
              else if ((dVar22 + dVar23) * dVar24 < 0.0) {
LAB_001105d4:
                dVar23 = -dVar23;
              }
            }
            *(double *)(lVar11 + lVar15 * 8) = dVar23 + *(double *)(lVar11 + lVar15 * 8);
            lVar15 = lVar15 + lVar20;
          } while (lVar15 < lVar14);
        }
        iVar6 = (**(code **)(lVar3 + 0x10))(t,uVar2,uVar1,*(undefined8 *)(lVar3 + 0x18));
        *(long *)((long)bp_data + 0x40) = *(long *)((long)bp_data + 0x40) + 1;
        if (iVar6 != 0) {
          if (-1 < iVar6) {
            return 1;
          }
          msgfmt = "The right-hand side routine failed in an unrecoverable manner.";
          iVar6 = 0x189;
          goto LAB_00110404;
        }
        lVar14 = *bp_data;
        lVar15 = local_a0;
        if (lVar12 <= lVar14) {
          do {
            dVar22 = *(double *)(lVar10 + j * 8);
            *(double *)(lVar11 + j * 8) = dVar22;
            psVar13 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bp_data + 0x18),j);
            dVar24 = local_b0 / *(double *)(lVar7 + j * 8);
            dVar23 = ABS(*(double *)(lVar10 + j * 8)) * local_c8;
            if (dVar23 <= dVar24) {
              dVar23 = dVar24;
            }
            if (*(int *)(lVar3 + 0x58) != 0) {
              dVar24 = *(double *)(local_b8 + j * 8);
              dVar25 = ABS(dVar24);
              if ((dVar25 != 1.0) || (NAN(dVar25))) {
                if ((dVar25 == 2.0) && ((!NAN(dVar25) && ((dVar22 + dVar23) * dVar24 <= 0.0))))
                goto LAB_00110700;
              }
              else if ((dVar22 + dVar23) * dVar24 < 0.0) {
LAB_00110700:
                dVar23 = -dVar23;
              }
            }
            lVar16 = j - *(long *)((long)bp_data + 0x10);
            lVar19 = 0;
            if (0 < lVar16) {
              lVar19 = lVar16;
            }
            lVar14 = *bp_data;
            lVar18 = *(long *)((long)bp_data + 8) + j;
            if (lVar14 + -1 <= lVar18) {
              lVar18 = lVar14 + -1;
            }
            if (lVar19 <= lVar18) {
              if (lVar16 < 1) {
                lVar16 = 0;
              }
              lVar16 = lVar16 + -1;
              do {
                *(double *)((long)psVar13 + lVar16 * 8 + lVar15 + 8) =
                     (*(double *)(lVar9 + 8 + lVar16 * 8) - *(double *)(lVar8 + 8 + lVar16 * 8)) *
                     (1.0 / dVar23);
                lVar16 = lVar16 + 1;
              } while (lVar16 < lVar18);
            }
            j = j + lVar20;
            lVar15 = lVar15 + ~(lVar4 + lVar5) * 8;
          } while (j < lVar14);
        }
        local_a0 = local_a0 + -8;
        bVar21 = lVar12 != lVar17;
        lVar12 = lVar12 + 1;
      } while (bVar21);
    }
    iVar6 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x192;
      goto LAB_00110404;
    }
  }
  else {
    *jcurPtr = 0;
    iVar6 = SUNMatCopy(*(undefined8 *)((long)bp_data + 0x18),*(undefined8 *)((long)bp_data + 0x20));
    if (iVar6 < 0) {
      msgfmt = "An error arose from a SUNBandMatrix routine.";
      iVar6 = 0x175;
      goto LAB_00110404;
    }
  }
  if (iVar6 != 0) {
    return 1;
  }
  iVar6 = SUNMatScaleAddI(-gamma,*(undefined8 *)((long)bp_data + 0x20));
  if (iVar6 == 0) {
    iVar6 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bp_data + 0x28),
                                *(SUNMatrix *)((long)bp_data + 0x20));
    return iVar6;
  }
  msgfmt = "An error arose from a SUNBandMatrix routine.";
  iVar6 = 0x19c;
LAB_00110404:
  cvProcessError(cv_mem,-1,iVar6,"CVBandPrecSetup",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                 ,msgfmt);
  return -1;
}

Assistant:

static int CVBandPrecSetup(sunrealtype t, N_Vector y, N_Vector fy,
                           sunbooleantype jok, sunbooleantype* jcurPtr,
                           sunrealtype gamma, void* bp_data)
{
  CVBandPrecData pdata;
  CVodeMem cv_mem;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata  = (CVBandPrecData)bp_data;
  cv_mem = (CVodeMem)pdata->cvode_mem;

  if (jok)
  {
    /* If jok = SUNTRUE, use saved copy of J. */
    *jcurPtr = SUNFALSE;
    retval   = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }
  else
  {
    /* If jok = SUNFALSE, call CVBandPDQJac for new J value. */
    *jcurPtr = SUNTRUE;
    retval   = SUNMatZero(pdata->savedJ);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = CVBandPDQJac(pdata, t, y, fy, pdata->tmp1, pdata->tmp2);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__,
                     MSGBP_RHSFUNC_FAILED);
      return (-1);
    }
    if (retval > 0) { return (1); }

    retval = SUNMatCopy(pdata->savedJ, pdata->savedP);
    if (retval < 0)
    {
      cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
      return (-1);
    }
    if (retval > 0) { return (1); }
  }

  /* Scale and add identity to get savedP = I - gamma*J. */
  retval = SUNMatScaleAddI(-gamma, pdata->savedP);
  if (retval)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBP_SUNMAT_FAIL);
    return (-1);
  }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->savedP);
  return (retval);
}